

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O1

void path2dirname(char *path,char *dir)

{
  long lVar1;
  size_t sVar2;
  size_t __n;
  
  sVar2 = strlen(path);
  do {
    if (sVar2 == 1) {
      *dir = '.';
      __n = 1;
      goto LAB_00109de4;
    }
    __n = sVar2 - 1;
    lVar1 = sVar2 - 1;
    sVar2 = __n;
  } while (path[lVar1] != '/');
  memcpy(dir,path,__n);
LAB_00109de4:
  dir[__n] = '\0';
  return;
}

Assistant:

void
path2dirname(const char *path, char *dir)
{
    size_t i, l;

    l = strlen(path);
#if defined(_WIN32) || defined(__CYGWIN__)
    for (i = l - 1; (i > 0) && !(path[i] == '/' || path[i] == '\\'); --i);
#else
    for (i = l - 1; (i > 0) && !(path[i] == '/'); --i);
#endif
    if (i == 0) {
        dir[0] = '.';
        dir[1] = '\0';
    } else {
        memcpy(dir, path, i);
        dir[i] = '\0';
    }
}